

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O2

Twine * __thiscall llvm::Twine::concat(Twine *__return_storage_ptr__,Twine *this,Twine *Suffix)

{
  NodeKind NVar1;
  undefined6 uVar2;
  NodeKind LHSKind;
  NodeKind NVar3;
  uint uVar4;
  undefined4 uVar5;
  uint uVar6;
  undefined4 uVar7;
  
  NVar3 = this->LHSKind;
  if ((NVar3 == NullKind) || (NVar1 = Suffix->LHSKind, NVar1 == NullKind)) {
    (__return_storage_ptr__->LHS).twine = (Twine *)0x0;
    (__return_storage_ptr__->RHS).twine = (Twine *)0x0;
    __return_storage_ptr__->LHSKind = NullKind;
    __return_storage_ptr__->RHSKind = EmptyKind;
  }
  else {
    if (NVar3 == EmptyKind) {
      NVar3 = Suffix->RHSKind;
      uVar2 = *(undefined6 *)&Suffix->field_0x12;
      __return_storage_ptr__->LHSKind = Suffix->LHSKind;
      __return_storage_ptr__->RHSKind = NVar3;
      *(undefined6 *)&__return_storage_ptr__->field_0x12 = uVar2;
      uVar4 = (Suffix->LHS).decUI;
      uVar5 = *(undefined4 *)((long)&Suffix->LHS + 4);
      uVar6 = (Suffix->RHS).decUI;
      uVar7 = *(undefined4 *)((long)&Suffix->RHS + 4);
    }
    else {
      if (NVar1 != EmptyKind) {
        LHSKind = TwineKind;
        if (this->RHSKind == EmptyKind) {
          this = *(Twine **)&this->LHS;
          LHSKind = NVar3;
        }
        NVar3 = TwineKind;
        if (Suffix->RHSKind == EmptyKind) {
          Suffix = *(Twine **)&Suffix->LHS;
          NVar3 = NVar1;
        }
        Twine(__return_storage_ptr__,(Child)this,LHSKind,(Child)Suffix,NVar3);
        return __return_storage_ptr__;
      }
      NVar3 = this->RHSKind;
      uVar2 = *(undefined6 *)&this->field_0x12;
      __return_storage_ptr__->LHSKind = this->LHSKind;
      __return_storage_ptr__->RHSKind = NVar3;
      *(undefined6 *)&__return_storage_ptr__->field_0x12 = uVar2;
      uVar4 = (this->LHS).decUI;
      uVar5 = *(undefined4 *)((long)&this->LHS + 4);
      uVar6 = (this->RHS).decUI;
      uVar7 = *(undefined4 *)((long)&this->RHS + 4);
    }
    (__return_storage_ptr__->LHS).decUI = uVar4;
    *(undefined4 *)((long)&__return_storage_ptr__->LHS + 4) = uVar5;
    (__return_storage_ptr__->RHS).decUI = uVar6;
    *(undefined4 *)((long)&__return_storage_ptr__->RHS + 4) = uVar7;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Twine Twine::concat(const Twine &Suffix) const {
    // Concatenation with null is null.
    if (isNull() || Suffix.isNull())
      return Twine(NullKind);

    // Concatenation with empty yields the other side.
    if (isEmpty())
      return Suffix;
    if (Suffix.isEmpty())
      return *this;

    // Otherwise we need to create a new node, taking care to fold in unary
    // twines.
    Child NewLHS, NewRHS;
    NewLHS.twine = this;
    NewRHS.twine = &Suffix;
    NodeKind NewLHSKind = TwineKind, NewRHSKind = TwineKind;
    if (isUnary()) {
      NewLHS = LHS;
      NewLHSKind = getLHSKind();
    }
    if (Suffix.isUnary()) {
      NewRHS = Suffix.LHS;
      NewRHSKind = Suffix.getLHSKind();
    }

    return Twine(NewLHS, NewLHSKind, NewRHS, NewRHSKind);
  }